

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadImageLibrary(ColladaParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar7;
  undefined4 extraout_var_01;
  string id;
  string local_a8;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  long *plStack_70;
  undefined8 local_68;
  long alStack_60 [2];
  key_type local_50;
  
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar4 != '\0')) {
    paVar1 = &local_a8.field_2;
    do {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 == 1) {
        if (iVar5 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"image");
        if (iVar4 == 0) {
          uVar6 = GetAttribute(this,"id");
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)CONCAT44(extraout_var_00,iVar4),
                     (allocator<char> *)&local_a8);
          alStack_60[1] = 0;
          local_68 = 0;
          local_a8.field_2._M_allocated_capacity = 0;
          local_a8.field_2._8_8_ = 0;
          local_a8._M_string_length = 0;
          local_78 = (pointer)0x0;
          local_88 = (pointer)0x0;
          puStack_80 = (pointer)0x0;
          plStack_70 = alStack_60;
          alStack_60[0] = 0;
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_a8);
          puVar2 = (pmVar7->mImageData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (pmVar7->mImageData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (pmVar7->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = local_88;
          (pmVar7->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puStack_80;
          (pmVar7->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
          local_88 = (pointer)0x0;
          puStack_80 = (pointer)0x0;
          local_78 = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)puVar3 - (long)puVar2);
          }
          std::__cxx11::string::operator=((string *)&pmVar7->mEmbeddedFormat,(string *)&plStack_70);
          if (plStack_70 != alStack_60) {
            operator_delete(plStack_70,alStack_60[0] + 1);
          }
          if (local_88 != (pointer)0x0) {
            operator_delete(local_88,(long)local_78 - (long)local_88);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          ReadImage(this,pmVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar5 == 2) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"library_images");
        if (iVar4 == 0) {
          return;
        }
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Expected end of <library_images> element.","");
        ThrowException(this,&local_a8);
      }
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar4 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadImageLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_images") != 0)
                ThrowException("Expected end of <library_images> element.");

            break;
        }
    }
}